

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_0::CurrentVertexAttribIntCase::test
          (CurrentVertexAttribIntCase *this)

{
  ostringstream *this_00;
  TestContext *testCtx;
  CallLogWrapper *this_01;
  bool bVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  int iVar6;
  undefined7 extraout_var;
  GLuint index;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int x;
  int y;
  int z;
  int w;
  int attribute_count;
  StateQueryMemoryWriteGuard<int[4]> attribValue;
  Random rnd;
  GLint local_21c;
  CallLogWrapper *local_218;
  CurrentVertexAttribIntCase *local_210;
  StateQueryMemoryWriteGuard<int[4]> local_208;
  int local_1d8;
  int iStack_1d4;
  int iStack_1d0;
  int iStack_1cc;
  deRandom local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  deRandom_init(&local_1c0,0xabcdef);
  local_21c = 0x10;
  local_218 = &(this->super_ApiCase).super_CallLogWrapper;
  local_210 = this;
  glu::CallLogWrapper::glGetIntegerv(local_218,0x8869,&local_21c);
  if (0 < local_21c) {
    this_00 = (ostringstream *)(local_1b0 + 8);
    index = 0;
    do {
      dVar2 = deRandom_getUint32(&local_1c0);
      dVar3 = deRandom_getUint32(&local_1c0);
      dVar4 = deRandom_getUint32(&local_1c0);
      dVar5 = deRandom_getUint32(&local_1c0);
      this_01 = local_218;
      auVar8._4_4_ = dVar3;
      auVar8._0_4_ = dVar3;
      auVar8._8_4_ = dVar5;
      auVar8._12_4_ = dVar5;
      x = dVar2 % 0x1f401 - 64000;
      y = dVar3 % 0x1f401 - 64000;
      z = dVar4 % 0x1f401 - 64000;
      w = (dVar5 - (int)(((auVar8._8_8_ & 0xffffffff) / 0x1f401) * 0x1f401)) + -64000;
      local_1d8 = x;
      iStack_1d4 = y;
      iStack_1d0 = z;
      iStack_1cc = w;
      glu::CallLogWrapper::glVertexAttribI4i(local_218,index,x,y,z,w);
      testCtx = (local_210->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
      local_208.m_postguard[0] = -0x21212122;
      local_208.m_postguard[1] = -0x21212122;
      local_208.m_postguard[2] = -0x21212122;
      local_208.m_postguard[3] = -0x21212122;
      local_208.m_value[0] = -0x21212122;
      local_208.m_value[1] = -0x21212122;
      local_208.m_value[2] = -0x21212122;
      local_208.m_value[3] = -0x21212122;
      local_208.m_preguard[0] = -0x21212122;
      local_208.m_preguard[1] = -0x21212122;
      local_208.m_preguard[2] = -0x21212122;
      local_208.m_preguard[3] = -0x21212122;
      glu::CallLogWrapper::glGetVertexAttribIiv(this_01,index,0x8626,local_208.m_value);
      bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[4]>::verifyValidity
                        (&local_208,testCtx);
      auVar7._0_4_ = -(uint)(local_1d8 == local_208.m_value[0]);
      auVar7._4_4_ = -(uint)(iStack_1d4 == local_208.m_value[1]);
      auVar7._8_4_ = -(uint)(iStack_1d0 == local_208.m_value[2]);
      auVar7._12_4_ = -(uint)(iStack_1cc == local_208.m_value[3]);
      iVar6 = movmskps((int)CONCAT71(extraout_var,bVar1),auVar7);
      if (iVar6 != 0xf) {
        local_1b0._0_8_ = testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"// ERROR: Expected [",0x14);
        std::ostream::operator<<(this_00,x);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
        std::ostream::operator<<(this_00,y);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
        std::ostream::operator<<(this_00,z);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
        std::ostream::operator<<(this_00,w);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"];",2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"got [",5);
        std::ostream::operator<<(this_00,local_208.m_value[0]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
        std::ostream::operator<<(this_00,local_208.m_value[1]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
        std::ostream::operator<<(this_00,local_208.m_value[2]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,",",1);
        std::ostream::operator<<(this_00,local_208.m_value[3]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"]",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_138);
        if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
          tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"got invalid attribute value")
          ;
        }
      }
      index = index + 1;
    } while ((int)index < local_21c);
  }
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		de::Random rnd(0xabcdef);

		int attribute_count = 16;
		glGetIntegerv(GL_MAX_VERTEX_ATTRIBS, &attribute_count);

		// test write float/read float

		for (int index = 0; index < attribute_count; ++index)
		{
			const GLint x = rnd.getInt(-64000, 64000);
			const GLint y = rnd.getInt(-64000, 64000);
			const GLint z = rnd.getInt(-64000, 64000);
			const GLint w = rnd.getInt(-64000, 64000);

			glVertexAttribI4i(index, x, y, z, w);
			verifyCurrentVertexAttribIi(m_testCtx, *this, index, x, y, z, w);
		}
	}